

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstalledFile.cxx
# Opt level: O1

void __thiscall
cmInstalledFile::AppendProperty
          (cmInstalledFile *this,cmMakefile *mf,string *prop,char *value,bool param_4)

{
  iterator __position;
  vector<cmCompiledGeneratorExpression*,std::allocator<cmCompiledGeneratorExpression*>> *this_00;
  cmGeneratorExpression ge;
  cmListFileBacktrace backtrace;
  cmGeneratorExpression local_68;
  cmGeneratorExpression local_60;
  cmCompiledGeneratorExpression *local_58;
  cmListFileBacktrace local_50;
  
  cmMakefile::GetBacktrace(&local_50,mf);
  cmGeneratorExpression::cmGeneratorExpression(&local_60,&local_50);
  this_00 = (vector<cmCompiledGeneratorExpression*,std::allocator<cmCompiledGeneratorExpression*>> *
            )std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile::Property>_>_>
             ::operator[](&this->Properties,prop);
  cmGeneratorExpression::Parse(&local_68,(char *)&local_60);
  local_58 = (cmCompiledGeneratorExpression *)local_68.Backtrace;
  local_68.Backtrace = (cmListFileBacktrace *)0x0;
  __position._M_current = *(cmCompiledGeneratorExpression ***)(this_00 + 8);
  if (__position._M_current == *(cmCompiledGeneratorExpression ***)(this_00 + 0x10)) {
    std::vector<cmCompiledGeneratorExpression*,std::allocator<cmCompiledGeneratorExpression*>>::
    _M_realloc_insert<cmCompiledGeneratorExpression*>(this_00,__position,&local_58);
  }
  else {
    *__position._M_current = local_58;
    *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
  }
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
            ((auto_ptr<cmCompiledGeneratorExpression> *)&local_68);
  cmGeneratorExpression::~cmGeneratorExpression(&local_60);
  std::vector<cmListFileContext,_std::allocator<cmListFileContext>_>::~vector
            (&local_50.super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>);
  return;
}

Assistant:

void cmInstalledFile::AppendProperty(cmMakefile const* mf,
  const std::string& prop, const char* value, bool /*asString*/)
{
  cmListFileBacktrace backtrace = mf->GetBacktrace();
  cmGeneratorExpression ge(&backtrace);

  Property& property = this->Properties[prop];
  property.ValueExpressions.push_back(ge.Parse(value).release());
}